

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O2

ngram_model_t *
ngram_model_set_init
          (ps_config_t *config,ngram_model_t **models,char **names,float32 *weights,int32 n_models)

{
  logmath_t *lmath;
  int iVar1;
  int iVar2;
  ngram_model_t *base;
  uint32 *puVar3;
  void *pvVar4;
  ngram_model_t *pnVar5;
  char *pcVar6;
  ulong uVar7;
  uint n;
  size_t n_elem;
  ulong uVar8;
  long lVar9;
  float64 fVar10;
  float64 fVar11;
  
  if (n_models != 0) {
    lmath = (*models)->lmath;
    n_elem = (size_t)n_models;
    lVar9 = 1;
    do {
      if ((long)n_elem <= lVar9) {
        base = (ngram_model_t *)
               __ckd_calloc__(1,0x90,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                              ,0x97);
        base[1].refcount = n_models;
        puVar3 = (uint32 *)
                 __ckd_calloc__(n_elem,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                                ,0x9a);
        base[1].n_counts = puVar3;
        pvVar4 = __ckd_calloc__(n_elem,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                                ,0x9b);
        *(void **)&base[1].n_1g_alloc = pvVar4;
        pvVar4 = __ckd_calloc__(n_elem,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                                ,0x9d);
        *(void **)&base[1].n = pvVar4;
        iVar1 = logmath_log(lmath,(float64)(1.0 / (double)n_models));
        uVar7 = 0;
        uVar8 = (ulong)(uint)n_models;
        if (n_models < 1) {
          uVar8 = uVar7;
        }
        for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
          *(int *)(*(long *)&base[1].n + uVar7 * 4) = iVar1;
        }
        if (weights != (float32 *)0x0) {
          *(undefined4 *)&base[1].field_0x4 = 0xffffffff;
        }
        n = 0;
        for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
          pnVar5 = ngram_model_retain(models[uVar7]);
          *(ngram_model_t **)(base[1].n_counts + uVar7 * 2) = pnVar5;
          pcVar6 = __ckd_salloc__(names[uVar7],
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                                  ,0xaa);
          *(char **)(*(long *)&base[1].n_1g_alloc + uVar7 * 8) = pcVar6;
          if (weights != (float32 *)0x0) {
            iVar1 = logmath_log(lmath,(float64)(double)(float)weights[uVar7]);
            *(int *)(*(long *)&base[1].n + uVar7 * 4) = iVar1;
          }
          if (n <= models[uVar7]->n) {
            n = (uint)models[uVar7]->n;
          }
        }
        pvVar4 = __ckd_calloc__((long)(int)(n - 1),4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                                ,0xb2);
        *(void **)&base[1].lw = pvVar4;
        build_widmap(base,lmath,n);
        return base;
      }
      fVar10 = logmath_get_base(models[lVar9]->lmath);
      fVar11 = logmath_get_base(lmath);
      if (((double)fVar10 != (double)fVar11) || (NAN((double)fVar10) || NAN((double)fVar11))) break;
      iVar1 = logmath_get_shift(models[lVar9]->lmath);
      iVar2 = logmath_get_shift(lmath);
      lVar9 = lVar9 + 1;
    } while (iVar1 == iVar2);
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
            ,0x91,"Log-math parameters don\'t match, will not create LM set\n");
  }
  return (ngram_model_t *)0x0;
}

Assistant:

ngram_model_t *
ngram_model_set_init(ps_config_t * config,
                     ngram_model_t ** models,
                     char **names, const float32 * weights, int32 n_models)
{
    ngram_model_set_t *model;
    ngram_model_t *base;
    logmath_t *lmath;
    int32 i, n;

    (void)config;
    if (n_models == 0)          /* WTF */
        return NULL;

    /* Do consistency checking on the models.  They must all use the
     * same logbase and shift. */
    lmath = models[0]->lmath;
    for (i = 1; i < n_models; ++i) {
        if (logmath_get_base(models[i]->lmath) != logmath_get_base(lmath)
            || logmath_get_shift(models[i]->lmath) !=
            logmath_get_shift(lmath)) {
            E_ERROR
                ("Log-math parameters don't match, will not create LM set\n");
            return NULL;
        }
    }

    /* Allocate the combined model, initialize it. */
    model = ckd_calloc(1, sizeof(*model));
    base = &model->base;
    model->n_models = n_models;
    model->lms = ckd_calloc(n_models, sizeof(*model->lms));
    model->names = ckd_calloc(n_models, sizeof(*model->names));
    /* Initialize weights to a uniform distribution */
    model->lweights = ckd_calloc(n_models, sizeof(*model->lweights));
    {
        int32 uniform = logmath_log(lmath, 1.0 / n_models);
        for (i = 0; i < n_models; ++i)
            model->lweights[i] = uniform;
    }
    /* Default to interpolate if weights were given. */
    if (weights)
        model->cur = -1;

    n = 0;
    for (i = 0; i < n_models; ++i) {
        model->lms[i] = ngram_model_retain(models[i]);
        model->names[i] = ckd_salloc(names[i]);
        if (weights)
            model->lweights[i] = logmath_log(lmath, weights[i]);
        /* N is the maximum of all merged models. */
        if (models[i]->n > n)
            n = models[i]->n;
    }
    /* Allocate the history mapping table. */
    model->maphist = ckd_calloc(n - 1, sizeof(*model->maphist));

    /* Now build the word-ID mapping and merged vocabulary. */
    build_widmap(base, lmath, n);
    return base;
}